

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::Printer::ValidateIndexLookupInBounds
          (Printer *this,size_t index,size_t current_arg_index,size_t args_len,PrintOptions opts)

{
  undefined8 uVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_00;
  PrintOptions opts_00;
  PrintOptions opts_01;
  Printer *local_48;
  size_t local_40;
  size_t local_38;
  bool extraout_DL;
  
  opts_00.use_annotation_frames = SUB81(current_arg_index,0);
  uVar1 = opts._0_8_;
  message.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::io::Printer::ValidateIndexLookupInBounds(unsigned_long,unsigned_long,unsigned_long,google::protobuf::io::Printer::PrintOptions)::__0,std::__cxx11::string>
  ;
  message.ptr_.obj = &local_48;
  opts_00.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)(short)uVar1;
  opts_00.checks_are_debug_only = (bool)(char)((ulong)uVar1 >> 0x10);
  opts_00.use_substitution_map = (bool)(char)((ulong)uVar1 >> 0x18);
  opts_00.use_curly_brace_substitutions = (bool)(char)((ulong)uVar1 >> 0x20);
  opts_00.allow_digit_substitutions = (bool)(char)((ulong)uVar1 >> 0x28);
  opts_00.strip_spaces_around_vars = (bool)(char)((ulong)uVar1 >> 0x30);
  opts_00.strip_raw_string_indentation = (bool)(char)((ulong)uVar1 >> 0x38);
  local_48 = this;
  local_40 = index;
  Validate(index < args_len,opts_00,message);
  if (index < args_len) {
    message_00.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::io::Printer::ValidateIndexLookupInBounds(unsigned_long,unsigned_long,unsigned_long,google::protobuf::io::Printer::PrintOptions)::__1,std::__cxx11::string>
    ;
    message_00.ptr_.obj = &local_48;
    opts_01.use_annotation_frames = extraout_DL;
    opts_01.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)(short)uVar1;
    opts_01.checks_are_debug_only = (bool)(char)((ulong)uVar1 >> 0x10);
    opts_01.use_substitution_map = (bool)(char)((ulong)uVar1 >> 0x18);
    opts_01.use_curly_brace_substitutions = (bool)(char)((ulong)uVar1 >> 0x20);
    opts_01.allow_digit_substitutions = (bool)(char)((ulong)uVar1 >> 0x28);
    opts_01.strip_spaces_around_vars = (bool)(char)((ulong)uVar1 >> 0x30);
    opts_01.strip_raw_string_indentation = (bool)(char)((ulong)uVar1 >> 0x38);
    local_48 = this;
    local_40 = index;
    local_38 = current_arg_index;
    Validate(index <= current_arg_index,opts_01,message_00);
  }
  return index < args_len && index <= current_arg_index;
}

Assistant:

bool Printer::ValidateIndexLookupInBounds(size_t index,
                                          size_t current_arg_index,
                                          size_t args_len, PrintOptions opts) {
  if (!Validate(index < args_len, opts, [this, index] {
        return absl::StrFormat("annotation %c{%d%c is out of bounds",
                               options_.variable_delimiter, index + 1,
                               options_.variable_delimiter);
      })) {
    return false;
  }
  if (!Validate(
          index <= current_arg_index, opts, [this, index, current_arg_index] {
            return absl::StrFormat(
                "annotation arg must be in correct order as given; expected "
                "%c{%d%c but got %c{%d%c",
                options_.variable_delimiter, current_arg_index + 1,
                options_.variable_delimiter, options_.variable_delimiter,
                index + 1, options_.variable_delimiter);
          })) {
    return false;
  }
  return true;
}